

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O1

void __thiscall Nova::Example<float,_1>::Example(Example<float,_1> *this,ostream *output_i)

{
  this->_vptr_Example = (_func_int **)&PTR__Example_0013d8b8;
  this->initial_time = 0.0;
  this->frame_rate = 24.0;
  this->first_frame = 0;
  this->last_frame = 0x78;
  this->restart_frame = 0;
  this->write_substeps_level = -1;
  this->test_number = 1;
  (this->frame_title)._M_dataplus._M_p = (pointer)&(this->frame_title).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->frame_title,"");
  (this->output_directory)._M_dataplus._M_p = (pointer)&(this->output_directory).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->output_directory,"output","");
  this->write_time = true;
  this->restart = false;
  this->write_output_files = true;
  this->write_frame_title = true;
  this->parse_args = (Parse_Args *)0x0;
  this->output = output_i;
  return;
}

Assistant:

Example<T,d>::
Example(std::ostream& output_i)
    :initial_time(0),frame_rate(24),first_frame(0),last_frame(120),restart_frame(0),write_substeps_level(-1),test_number(1),frame_title(""),
    output_directory("output"),write_time(true),restart(false),write_output_files(true),write_frame_title(true),parse_args(nullptr),output(&output_i)
{}